

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string * duckdb::StringUtil::GetFileName(string *__return_storage_ptr__,string *file_path)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = ::std::__cxx11::string::find_last_of((char *)file_path,0x1335225,0xffffffffffffffff);
  if (uVar2 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (file_path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + file_path->_M_string_length);
  }
  else {
    uVar5 = file_path->_M_string_length - 1;
    lVar3 = ::std::__cxx11::string::find_first_not_of((char *)file_path,0x1335228,uVar2);
    if (lVar3 == -1) {
      if (uVar5 != 0) {
        do {
          uVar4 = (byte)(file_path->_M_dataplus)._M_p[uVar5] - 0x2e;
          if ((0x2e < uVar4) || ((0x400000000003U >> ((ulong)uVar4 & 0x3f) & 1) == 0))
          goto LAB_003909e9;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar5 = 0;
LAB_003909e9:
      ::std::__cxx11::string::find_last_of((char *)file_path,0x1335225,uVar5);
    }
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file_path);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::GetFileName(const string &file_path) {

	idx_t pos = file_path.find_last_of("/\\");
	if (pos == string::npos) {
		return file_path;
	}
	auto end = file_path.size() - 1;

	// If the rest of the string is just slashes or dots, trim them
	if (file_path.find_first_not_of("/\\.", pos) == string::npos) {
		// Trim the trailing slashes and dots
		while (end > 0 && (file_path[end] == '/' || file_path[end] == '.' || file_path[end] == '\\')) {
			end--;
		}

		// Now find the next slash
		pos = file_path.find_last_of("/\\", end);
		if (pos == string::npos) {
			return file_path.substr(0, end + 1);
		}
	}

	return file_path.substr(pos + 1, end - pos);
}